

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevc.cpp
# Opt level: O2

string * __thiscall
HevcUnitWithProfile::getProfileString_abi_cxx11_
          (string *__return_storage_ptr__,HevcUnitWithProfile *this)

{
  uint local_34;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"Profile: ",(allocator<char> *)&local_30);
  switch(this->profile_idc) {
  case '\0':
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Not defined",(allocator<char> *)&local_34);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    break;
  case '\x01':
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Main",(allocator<char> *)&local_34);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    break;
  case '\x02':
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Main10",(allocator<char> *)&local_34);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    break;
  case '\x03':
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"MainStillPicture",(allocator<char> *)&local_34);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    break;
  default:
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    goto LAB_0019d27e;
  }
  std::__cxx11::string::~string((string *)&local_30);
LAB_0019d27e:
  if (this->level_idc != '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"@",(allocator<char> *)&local_34);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_30);
    local_34 = (uint)(this->level_idc / 0x1e);
    int32ToStr_abi_cxx11_(&local_30,(int32_t *)&local_34);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,".",(allocator<char> *)&local_34);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_30);
    local_34 = (uint)(byte)((ushort)((ushort)this->level_idc % 0x1e) / 3);
    int32ToStr_abi_cxx11_(&local_30,(int32_t *)&local_34);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string HevcUnitWithProfile::getProfileString() const
{
    string rez("Profile: ");
    if (profile_idc == 1)
        rez += string("Main");
    else if (profile_idc == 2)
        rez += string("Main10");
    else if (profile_idc == 3)
        rez += string("MainStillPicture");
    else if (profile_idc == 0)
        rez += string("Not defined");
    else
        rez += "Unknown";
    if (level_idc)
    {
        rez += string("@");
        rez += int32ToStr(level_idc / 30);
        rez += string(".");
        rez += int32ToStr((level_idc % 30) / 3);
    }
    return rez;
}